

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

Param * __thiscall kratos::Generator::parameter(Generator *this,string *parameter_name)

{
  undefined1 local_38 [16];
  shared_ptr<kratos::Param> ptr;
  
  local_38._0_8_ = this;
  std::make_shared<kratos::Param,kratos::Generator*,std::__cxx11::string_const&>
            ((Generator **)(local_38 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>>
  ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::Param>&>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>>
              *)&this->params_,parameter_name,(shared_ptr<kratos::Param> *)(local_38 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ptr);
  return (Param *)local_38._8_8_;
}

Assistant:

Param &Generator::parameter(const std::string &parameter_name) {
    auto ptr = std::make_shared<Param>(this, parameter_name);
    params_.emplace(parameter_name, ptr);
    return *ptr;
}